

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O2

void __thiscall docopt::LeafPattern::~LeafPattern(LeafPattern *this)

{
  (this->super_Pattern)._vptr_Pattern = (_func_int **)&PTR_flat_001d73a0;
  value::~value(&this->fValue);
  std::__cxx11::string::~string((string *)&this->fName);
  return;
}

Assistant:

LeafPattern(std::string name, value v = {})
		: fName(std::move(name)),
		  fValue(std::move(v))
		{}